

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cc
# Opt level: O1

void __thiscall t_callback_library::f_scan(t_callback_library *this,t_scan a_scan)

{
  (*a_scan)((this->v_symbol_on_message).v_p._M_b._M_p);
  (*a_scan)((this->v_type_client).v_slot.v_p._M_b._M_p);
  (*a_scan)((this->v_type_server).v_slot.v_p._M_b._M_p);
  return;
}

Assistant:

void t_callback_library::f_scan(t_scan a_scan)
{
	a_scan(v_symbol_on_message);
	a_scan(v_type_client);
	a_scan(v_type_server);
}